

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindAllExtensionNumbers
          (MergedDescriptorDatabase *this,string *extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  insert_iterator<std::vector<int,_std::allocator<int>_>_> __result_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  _Rb_tree_const_iterator<int> __first_00;
  uint uVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppDVar4;
  iterator __i;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> iVar5;
  int i;
  bool success;
  vector<int,_std::allocator<int>_> results;
  set<int,_std::less<int>,_std::allocator<int>_> merged_results;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  byte bVar6;
  vector<int,_std::allocator<int>_> *this_00;
  _Iter local_120;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  _Iter in_stack_fffffffffffffef0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  insert_iterator<std::vector<int,_std::allocator<int>_>_> local_d0;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_b0;
  _Base_ptr local_a0;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> local_98;
  int *local_88;
  int *local_80;
  int local_68;
  byte local_61;
  undefined1 local_60 [24];
  set<int,_std::less<int>,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x54e2e9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x54e2f6);
  local_61 = 0;
  local_68 = 0;
  while( true ) {
    uVar2 = (ulong)local_68;
    sVar3 = std::
            vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ::size((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                    *)(in_RDI + 8));
    if (sVar3 <= uVar2) break;
    ppDVar4 = std::
              vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ::operator[]((vector<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                            *)(in_RDI + 8),(long)local_68);
    uVar1 = (*(*ppDVar4)->_vptr_DescriptorDatabase[5])(*ppDVar4,local_10,local_60);
    iVar5.iter._M_node = local_120._M_node;
    iVar5.container = in_stack_fffffffffffffee8;
    in_stack_ffffffffffffff07 = (undefined1)uVar1;
    if ((uVar1 & 1) != 0) {
      in_stack_fffffffffffffef0._M_current = (int *)local_60;
      local_80 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)
                                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      in_stack_fffffffffffffef8._M_current = (int *)(local_60 + 0x18);
      local_a0 = (_Base_ptr)
                 std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::insert_iterator
                (&local_98,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 in_stack_fffffffffffffef8._M_current,(_Iter)local_a0);
      __first._M_current._7_1_ = in_stack_ffffffffffffff07;
      __first._M_current._0_7_ = in_stack_ffffffffffffff00;
      __result.iter._M_node = (_Base_ptr)in_stack_fffffffffffffef0._M_current;
      __result.container = in_stack_fffffffffffffee8;
      iVar5 = std::
              copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
                        (__first,in_stack_fffffffffffffef8,__result);
      local_61 = 1;
      local_b0 = iVar5;
    }
    local_120 = iVar5.iter._M_node;
    in_stack_fffffffffffffee8 = iVar5.container;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x54e471);
    local_68 = local_68 + 1;
  }
  this_00 = (vector<int,_std::allocator<int>_> *)(local_60 + 0x18);
  local_b8 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  local_c0 = (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  __i = std::vector<int,_std::allocator<int>_>::end
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::insert_iterator<std::vector<int,_std::allocator<int>_>_>::insert_iterator
            (&local_d0,local_18,(_Iter)__i._M_current);
  __first_00._M_node._7_1_ = in_stack_ffffffffffffff07;
  __first_00._M_node._0_7_ = in_stack_ffffffffffffff00;
  __result_00.iter._M_current = in_stack_fffffffffffffef0._M_current;
  __result_00.container = (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8;
  std::
  copy<std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<int,std::allocator<int>>>>
            (__first_00,(_Rb_tree_const_iterator<int>)in_stack_fffffffffffffef8._M_current,
             __result_00);
  bVar6 = local_61;
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x54e547);
  return (bool)(bVar6 & 1);
}

Assistant:

bool MergedDescriptorDatabase::FindAllExtensionNumbers(
    const std::string& extendee_type, std::vector<int>* output) {
  std::set<int> merged_results;
  std::vector<int> results;
  bool success = false;

  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindAllExtensionNumbers(extendee_type, &results)) {
      std::copy(results.begin(), results.end(),
                std::insert_iterator<std::set<int> >(merged_results,
                                                     merged_results.begin()));
      success = true;
    }
    results.clear();
  }

  std::copy(merged_results.begin(), merged_results.end(),
            std::insert_iterator<std::vector<int> >(*output, output->end()));

  return success;
}